

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::mouseMoveEvent(QGroupBox *this,QMouseEvent *event)

{
  byte bVar1;
  int iVar2;
  QGroupBoxPrivate *this_00;
  QWidget *this_01;
  QStyle *pQVar3;
  QEvent *in_RSI;
  QStyleOptionGroupBox *in_RDI;
  long in_FS_OFFSET;
  bool oldOverCheckBox;
  SubControl pressed;
  QGroupBoxPrivate *d;
  QStyleOptionGroupBox box;
  QWidget *in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 uVar4;
  QPoint local_98;
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGroupBox *)0x5a5565);
  memset(local_90,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)0x5a5588);
  (**(code **)(*(long *)&(in_RDI->super_QStyleOptionComplex).super_QStyleOption + 0x1a0))
            (in_RDI,local_90);
  this_01 = (QWidget *)QWidget::style(in_stack_ffffffffffffff18);
  QSinglePointEvent::position((QSinglePointEvent *)0x5a55b3);
  local_98 = QPointF::toPoint((QPointF *)this_00);
  iVar2 = (**(code **)(*(long *)this_01 + 0xd0))(this_01,7,local_90,&local_98,in_RDI);
  bVar1 = this_00->overCheckBox & 1;
  uVar4 = iVar2 == 1 || iVar2 == 2;
  this_00->overCheckBox = (bool)uVar4;
  if (((this_00->checkable & 1U) != 0) &&
     (((this_00->pressedControl == SC_ComboBoxFrame ||
       (this_00->pressedControl == SC_ComboBoxEditField)) && ((this_00->overCheckBox & 1U) != bVar1)
      ))) {
    pQVar3 = QWidget::style(this_01);
    (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,7,local_90,1,in_RDI);
    QWidget::update((QWidget *)
                    CONCAT44(iVar2,CONCAT13(bVar1,CONCAT12(uVar4,in_stack_ffffffffffffff28))),
                    (QRect *)in_RDI);
  }
  QEvent::ignore(in_RSI);
  QStyleOptionGroupBox::~QStyleOptionGroupBox(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QGroupBox);
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    QStyle::SubControl pressed = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                event->position().toPoint(), this);
    bool oldOverCheckBox = d->overCheckBox;
    d->overCheckBox = (pressed == QStyle::SC_GroupBoxCheckBox || pressed == QStyle::SC_GroupBoxLabel);
    if (d->checkable && (d->pressedControl == QStyle::SC_GroupBoxCheckBox || d->pressedControl == QStyle::SC_GroupBoxLabel)
        && (d->overCheckBox != oldOverCheckBox))
        update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));

    event->ignore();
}